

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * __thiscall BigInt::operator/(BigInt *__return_storage_ptr__,BigInt *this,longlong val)

{
  pair<BigInt,_long_long> pStack_38;
  
  divModValue(&pStack_38,this,val);
  BigInt(__return_storage_ptr__,&pStack_38.first);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&pStack_38);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator/(long long val) const { //! divide by val
        return divModValue(val).first;
    }